

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

any __thiscall
cs_impl::
cni_helper<cs_impl::any_(*)(std::_List_iterator<cs_impl::any>_&),_cs_impl::any_(*)(std::_List_iterator<cs_impl::any>_&)>
::_call<0>(cni_helper<cs_impl::any_(*)(std::_List_iterator<cs_impl::any>_&),_cs_impl::any_(*)(std::_List_iterator<cs_impl::any>_&)>
           *this,vector *args,sequence<0> *param_2)

{
  _List_iterator<cs_impl::any> *p_Var1;
  any local_20;
  
  p_Var1 = try_convert_and_check<std::_List_iterator<cs_impl::any>_&,_std::_List_iterator<cs_impl::any>_&,_std::_List_iterator<cs_impl::any>,_0UL>
           ::convert(*(var **)param_2);
  if ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)args[1].super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
              super__Vector_impl_data._M_start)(&local_20,args,p_Var1);
    *(proxy **)&(this->mFunc).super__Function_base._M_functor = local_20.mDat;
    local_20.mDat = (proxy *)0x0;
    any::recycle(&local_20);
    return (any)(proxy *)this;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}